

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

Vec_Int_t * Abc_SclExtractBarBufs(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  Mio_Gate_t *pMVar3;
  Vec_Int_t *pVVar4;
  int *__ptr;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  pMVar3 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
  if (pMVar3 == (Mio_Gate_t *)0x0) {
    puts("Cannot find buffer in the current library. Quitting.");
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    __ptr = (int *)malloc(400);
    pVVar4->pArray = __ptr;
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        plVar2 = (long *)pVVar6->pArray[lVar7];
        if ((((plVar2 != (long *)0x0) && (*(int *)(*plVar2 + 4) == 4)) &&
            ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
           ((*(int *)((long)plVar2 + 0x1c) == 1 && (plVar2[7] == 0)))) {
          plVar2[7] = (long)pMVar3;
          uVar1 = pVVar4->nSize;
          if (uVar1 == pVVar4->nCap) {
            if ((int)uVar1 < 0x10) {
              if (__ptr == (int *)0x0) {
                __ptr = (int *)malloc(0x40);
              }
              else {
                __ptr = (int *)realloc(__ptr,0x40);
              }
              pVVar4->pArray = __ptr;
              iVar5 = 0x10;
              if (__ptr == (int *)0x0) {
LAB_0047aa8b:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
            else {
              if (__ptr == (int *)0x0) {
                __ptr = (int *)malloc((ulong)uVar1 * 8);
              }
              else {
                __ptr = (int *)realloc(__ptr,(ulong)uVar1 * 8);
              }
              pVVar4->pArray = __ptr;
              if (__ptr == (int *)0x0) goto LAB_0047aa8b;
              iVar5 = uVar1 * 2;
            }
            pVVar4->nCap = iVar5;
          }
          pVVar4->nSize = uVar1 + 1;
          __ptr[(int)uVar1] = (int)lVar7;
          pVVar6 = pNtk->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_SclExtractBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vBufs;
    Mio_Gate_t * pBuffer;
    Abc_Obj_t * pObj; int i;
    pBuffer = Mio_LibraryReadBuf( (Mio_Library_t *)pNtk->pManFunc );
    if ( pBuffer == NULL )
    {
        printf( "Cannot find buffer in the current library. Quitting.\n" );
        return NULL;
    }
    vBufs = Vec_IntAlloc( 100 );
    Abc_NtkForEachBarBuf( pNtk, pObj, i )
    {
        assert( pObj->pData == NULL );
        pObj->pData = pBuffer;
        Vec_IntPush( vBufs, i );
    }
    return vBufs;
}